

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

FrameDisplay * __thiscall
Js::InterpreterStackFrame::NewFrameDisplay(InterpreterStackFrame *this,void *argHead,void *argEnv)

{
  undefined2 uVar1;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  FrameDisplay *pFVar6;
  undefined4 *puVar7;
  void *item;
  uint index;
  uint index_00;
  
  uVar1 = *(undefined2 *)
           &((*(FunctionBody **)(this + 0x88))->super_ParseableFunctionInfo).super_FunctionProxy.
            field_0x45;
  bVar3 = FunctionBody::DoStackFrameDisplay(*(FunctionBody **)(this + 0x88));
  if ((!bVar3) || (pFVar6 = GetLocalFrameDisplay(this), pFVar6 == (FrameDisplay *)0x0)) {
    pFVar6 = OP_LdFrameDisplay(this,argHead,argEnv,*(ScriptContext **)(this + 0x78));
    *(FrameDisplay **)(this + 0x50) = pFVar6;
    return pFVar6;
  }
  pFVar6 = GetLocalFrameDisplay(this);
  if (pFVar6 == (FrameDisplay *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1d22,"(frameDisplay != nullptr)","frameDisplay != nullptr");
    if (!bVar3) goto LAB_009756ea;
    *puVar7 = 0;
  }
  pFVar6->tag = true;
  pFVar6->strictMode = (Type)((byte)((ushort)uVar1 >> 8) & 1);
  uVar5 = *(int *)(*(long *)(this + 0x88) + 0x158) + 1;
  pFVar6->length = (Type)uVar5;
  uVar4 = *(ushort *)((long)argEnv + 2);
  if (uVar4 + 1 != (uVar5 & 0xffff)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1d27,
                                "(frameDisplay->GetLength() == ((FrameDisplay*)argEnv)->GetLength() + 1)"
                                ,
                                "frameDisplay->GetLength() == ((FrameDisplay*)argEnv)->GetLength() + 1"
                               );
    if (!bVar3) {
LAB_009756ea:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
    uVar4 = *(ushort *)((long)argEnv + 2);
  }
  if (uVar4 != 0) {
    index = 0;
    do {
      index_00 = index + 1;
      item = FrameDisplay::GetItem((FrameDisplay *)argEnv,index);
      FrameDisplay::SetItem(pFVar6,index_00,item);
      index = index_00;
    } while (index_00 < *(ushort *)((long)argEnv + 2));
  }
  FrameDisplay::SetItem(pFVar6,0,argHead);
  return pFVar6;
}

Assistant:

FrameDisplay *
        InterpreterStackFrame::NewFrameDisplay(void *argHead, void *argEnv)
    {
        FrameDisplay *frameDisplay;
        bool strict = this->m_functionBody->GetIsStrictMode();

        if (!this->m_functionBody->DoStackFrameDisplay() || !this->GetLocalFrameDisplay())
        {
            // Null local frame display probably indicates that we bailed out of an inlinee.
            // Once we support stack closures in inlined functions, we can just assert that this value
            // is never null if we should be allocating on the stack.
            return this->OP_LdFrameDisplaySetLocal(argHead, argEnv, this->GetScriptContext());
        }

        frameDisplay = this->GetLocalFrameDisplay();
        Assert(frameDisplay != nullptr);

        frameDisplay->SetTag(true);
        frameDisplay->SetStrictMode(strict);
        frameDisplay->SetLength(this->m_functionBody->GetEnvDepth() + 1);
        Assert(frameDisplay->GetLength() == ((FrameDisplay*)argEnv)->GetLength() + 1);

        for (uint i = 0; i < ((FrameDisplay*)argEnv)->GetLength(); i++)
        {
            frameDisplay->SetItem(i + 1, ((FrameDisplay*)argEnv)->GetItem(i));
        }
        frameDisplay->SetItem(0, argHead);

        return frameDisplay;
    }